

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

void __thiscall
absl::lts_20250127::container_internal::GroupSse2Impl::ConvertSpecialToEmptyAndFullToDeleted
          (GroupSse2Impl *this,ctrl_t *dst)

{
  undefined8 in_RDX;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qb;
  __m128i b;
  __m128i a;
  __m128i res;
  __m128i special_mask;
  __m128i zero;
  __m128i x126;
  __m128i msbs;
  ctrl_t *dst_local;
  GroupSse2Impl *this_local;
  
  b[1]._0_1_ = 0x7e;
  b[0] = in_RDX;
  b[1]._1_7_ = 0;
  a[1] = (longlong)dst;
  a[0] = (longlong)this;
  _mm_cmpgt_epi8_fixed(a,b);
  *(undefined8 *)dst =
       ((extraout_XMM0_Qa ^ 0xffffffff00000000) & 0x7e7e7e7effffffff ^ 0xffffffff) &
       0xffffffff7e7e7e7e | 0x8080808080808080;
  *(undefined8 *)(dst + 8) =
       ((extraout_XMM0_Qb ^ 0xffffffff00000000) & 0x7e7e7e7effffffff ^ 0xffffffff) &
       0xffffffff7e7e7e7e | 0x8080808080808080;
  return;
}

Assistant:

void ConvertSpecialToEmptyAndFullToDeleted(ctrl_t* dst) const {
    auto msbs = _mm_set1_epi8(static_cast<char>(-128));
    auto x126 = _mm_set1_epi8(126);
#ifdef ABSL_INTERNAL_HAVE_SSSE3
    auto res = _mm_or_si128(_mm_shuffle_epi8(x126, ctrl), msbs);
#else
    auto zero = _mm_setzero_si128();
    auto special_mask = _mm_cmpgt_epi8_fixed(zero, ctrl);
    auto res = _mm_or_si128(msbs, _mm_andnot_si128(special_mask, x126));
#endif
    _mm_storeu_si128(reinterpret_cast<__m128i*>(dst), res);
  }